

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall NetworkError::NetworkError(NetworkError *this,int type,string *id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ENerror::ENerror(&this->super_ENerror);
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00153b20;
  if ((uint)type < 9) {
    (this->super_ENerror).code = NetworkErrorCodes[(uint)type];
    std::operator+(&local_40,
                   _ZL16NetworkErrorMsgs_rel +
                   *(int *)(_ZL16NetworkErrorMsgs_rel + (ulong)(uint)type * 4),id);
    std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

NetworkError::NetworkError(int type, string id)
{
    if (type >= 0 && type < NETWORK_ERROR_LIMIT)
    {
        code = NetworkErrorCodes[type];
        msg = NetworkErrorMsgs[type] + id;
    }
}